

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_fixture.c
# Opt level: O3

REF_STATUS ref_fixture_hanging_hex_pri_grid(REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi)

{
  REF_GRID_conflict pRVar1;
  REF_NODE ref_node;
  REF_DBL *pRVar2;
  REF_DBL *pRVar3;
  uint uVar4;
  undefined8 uVar5;
  char *pcVar6;
  REF_INT node;
  REF_INT cell;
  int local_50;
  REF_INT local_4c;
  REF_INT local_48 [10];
  
  local_48[4] = 4;
  local_48[5] = 5;
  local_48[6] = 6;
  local_48[7] = 7;
  local_48[0] = 0;
  local_48[1] = 1;
  local_48[2] = 2;
  local_48[3] = 3;
  uVar4 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar4 == 0) {
    pRVar1 = *ref_grid_ptr;
    ref_node = pRVar1->node;
    uVar4 = ref_node_add(ref_node,0,&local_50);
    if (uVar4 == 0) {
      pRVar2 = ref_node->real;
      pRVar3 = pRVar2 + (long)local_50 * 0xf;
      *pRVar3 = 0.0;
      pRVar3[1] = 0.0;
      pRVar2[(long)local_50 * 0xf + 2] = 0.0;
      uVar4 = ref_node_add(ref_node,1,&local_50);
      if (uVar4 == 0) {
        pRVar3 = ref_node->real;
        pRVar3[(long)local_50 * 0xf] = 1.0;
        pRVar3 = pRVar3 + (long)local_50 * 0xf + 1;
        *pRVar3 = 0.0;
        pRVar3[1] = 0.0;
        uVar4 = ref_node_add(ref_node,2,&local_50);
        if (uVar4 == 0) {
          pRVar2 = ref_node->real;
          pRVar3 = pRVar2 + (long)local_50 * 0xf;
          *pRVar3 = 1.0;
          pRVar3[1] = 1.0;
          pRVar2[(long)local_50 * 0xf + 2] = 0.0;
          uVar4 = ref_node_add(ref_node,3,&local_50);
          if (uVar4 == 0) {
            pRVar2 = ref_node->real;
            pRVar3 = pRVar2 + (long)local_50 * 0xf;
            *(undefined4 *)pRVar3 = 0;
            *(undefined4 *)((long)pRVar3 + 4) = 0;
            *(undefined4 *)(pRVar3 + 1) = 0;
            *(undefined4 *)((long)pRVar3 + 0xc) = 0x3ff00000;
            pRVar2[(long)local_50 * 0xf + 2] = 0.0;
            uVar4 = ref_node_add(ref_node,4,&local_50);
            if (uVar4 == 0) {
              pRVar2 = ref_node->real;
              pRVar3 = pRVar2 + (long)local_50 * 0xf;
              *pRVar3 = 0.0;
              pRVar3[1] = 0.0;
              pRVar2[(long)local_50 * 0xf + 2] = 1.0;
              uVar4 = ref_node_add(ref_node,5,&local_50);
              if (uVar4 == 0) {
                pRVar2 = ref_node->real;
                pRVar3 = pRVar2 + (long)local_50 * 0xf;
                *pRVar3 = 1.0;
                pRVar3[1] = 0.0;
                pRVar2[(long)local_50 * 0xf + 2] = 1.0;
                uVar4 = ref_node_add(ref_node,6,&local_50);
                if (uVar4 == 0) {
                  pRVar2 = ref_node->real;
                  pRVar3 = pRVar2 + (long)local_50 * 0xf;
                  *pRVar3 = 1.0;
                  pRVar3[1] = 1.0;
                  pRVar2[(long)local_50 * 0xf + 2] = 1.0;
                  uVar4 = ref_node_add(ref_node,7,&local_50);
                  if (uVar4 == 0) {
                    pRVar2 = ref_node->real;
                    pRVar3 = pRVar2 + (long)local_50 * 0xf;
                    *(undefined4 *)pRVar3 = 0;
                    *(undefined4 *)((long)pRVar3 + 4) = 0;
                    *(undefined4 *)(pRVar3 + 1) = 0;
                    *(undefined4 *)((long)pRVar3 + 0xc) = 0x3ff00000;
                    pRVar2[(long)local_50 * 0xf + 2] = 1.0;
                    uVar4 = ref_cell_add(pRVar1->cell[0xb],local_48,&local_4c);
                    if (uVar4 == 0) {
                      local_48[0] = 0;
                      local_48[1] = 1;
                      local_48[2] = 2;
                      local_48[3] = 3;
                      local_48[4] = 10;
                      uVar4 = ref_cell_add(pRVar1->cell[6],local_48,&local_4c);
                      if (uVar4 == 0) {
                        local_48[0] = 1;
                        local_48[1] = 5;
                        local_48[2] = 6;
                        local_48[3] = 2;
                        local_48[4] = 10;
                        uVar4 = ref_cell_add(pRVar1->cell[6],local_48,&local_4c);
                        if (uVar4 == 0) {
                          local_48[0] = 0;
                          local_48[1] = 3;
                          local_48[2] = 7;
                          local_48[3] = 4;
                          local_48[4] = 10;
                          uVar4 = ref_cell_add(pRVar1->cell[6],local_48,&local_4c);
                          if (uVar4 == 0) {
                            local_48[0] = 0;
                            local_48[1] = 4;
                            local_48[2] = 5;
                            local_48[3] = 1;
                            local_48[4] = 10;
                            uVar4 = ref_cell_add(pRVar1->cell[6],local_48,&local_4c);
                            if (uVar4 == 0) {
                              local_48[0] = 2;
                              local_48[1] = 6;
                              local_48[2] = 7;
                              local_48[3] = 3;
                              local_48[4] = 10;
                              uVar4 = ref_cell_add(pRVar1->cell[6],local_48,&local_4c);
                              if (uVar4 == 0) {
                                uVar4 = ref_node_add(ref_node,8,&local_50);
                                if (uVar4 == 0) {
                                  pRVar2 = ref_node->real;
                                  pRVar3 = pRVar2 + (long)local_50 * 0xf;
                                  *pRVar3 = 0.0;
                                  pRVar3[1] = 0.0;
                                  pRVar2[(long)local_50 * 0xf + 2] = 2.0;
                                  uVar4 = ref_node_add(ref_node,9,&local_50);
                                  if (uVar4 == 0) {
                                    pRVar2 = ref_node->real;
                                    pRVar3 = pRVar2 + (long)local_50 * 0xf;
                                    *pRVar3 = 1.0;
                                    pRVar3[1] = 0.0;
                                    pRVar2[(long)local_50 * 0xf + 2] = 2.0;
                                    uVar4 = ref_node_add(ref_node,10,&local_50);
                                    if (uVar4 == 0) {
                                      pRVar2 = ref_node->real;
                                      pRVar3 = pRVar2 + (long)local_50 * 0xf;
                                      *pRVar3 = 1.0;
                                      pRVar3[1] = 1.0;
                                      pRVar2[(long)local_50 * 0xf + 2] = 2.0;
                                      uVar4 = ref_node_add(ref_node,0xb,&local_50);
                                      if (uVar4 == 0) {
                                        pRVar2 = ref_node->real;
                                        pRVar3 = pRVar2 + (long)local_50 * 0xf;
                                        *(undefined4 *)pRVar3 = 0;
                                        *(undefined4 *)((long)pRVar3 + 4) = 0;
                                        *(undefined4 *)(pRVar3 + 1) = 0;
                                        *(undefined4 *)((long)pRVar3 + 0xc) = 0x3ff00000;
                                        pRVar2[(long)local_50 * 0xf + 2] = 2.0;
                                        local_48[0] = 4;
                                        local_48[1] = 5;
                                        local_48[2] = 7;
                                        local_48[3] = 8;
                                        local_48[4] = 9;
                                        local_48[5] = 0xb;
                                        uVar4 = ref_cell_add(pRVar1->cell[10],local_48,&local_4c);
                                        if (uVar4 == 0) {
                                          local_48[0] = 5;
                                          local_48[1] = 6;
                                          local_48[2] = 7;
                                          local_48[3] = 9;
                                          local_48[4] = 10;
                                          local_48[5] = 0xb;
                                          uVar4 = ref_cell_add(pRVar1->cell[10],local_48,&local_4c);
                                          if (uVar4 == 0) {
                                            local_48[0] = 5;
                                            local_48[1] = 9;
                                            local_48[2] = 10;
                                            local_48[3] = 6;
                                            local_48[4] = 10;
                                            uVar4 = ref_cell_add(pRVar1->cell[6],local_48,&local_4c)
                                            ;
                                            if (uVar4 == 0) {
                                              local_48[0] = 4;
                                              local_48[1] = 7;
                                              local_48[2] = 0xb;
                                              local_48[3] = 8;
                                              local_48[4] = 10;
                                              uVar4 = ref_cell_add(pRVar1->cell[6],local_48,
                                                                   &local_4c);
                                              if (uVar4 == 0) {
                                                local_48[0] = 4;
                                                local_48[1] = 8;
                                                local_48[2] = 9;
                                                local_48[3] = 5;
                                                local_48[4] = 10;
                                                uVar4 = ref_cell_add(pRVar1->cell[6],local_48,
                                                                     &local_4c);
                                                if (uVar4 == 0) {
                                                  local_48[0] = 6;
                                                  local_48[1] = 10;
                                                  local_48[2] = 0xb;
                                                  local_48[3] = 7;
                                                  local_48[4] = 10;
                                                  uVar4 = ref_cell_add(pRVar1->cell[6],local_48,
                                                                       &local_4c);
                                                  if (uVar4 == 0) {
                                                    local_48[0] = 8;
                                                    local_48[1] = 0xb;
                                                    local_48[2] = 9;
                                                    local_48[3] = 10;
                                                    uVar4 = ref_cell_add(pRVar1->cell[3],local_48,
                                                                         &local_4c);
                                                    if (uVar4 == 0) {
                                                      local_48[0] = 9;
                                                      local_48[1] = 0xb;
                                                      local_48[2] = 10;
                                                      local_48[3] = 10;
                                                      uVar4 = ref_cell_add(pRVar1->cell[3],local_48,
                                                                           &local_4c);
                                                      if (uVar4 == 0) {
                                                        uVar4 = ref_node_initialize_n_global
                                                                          (ref_node,0xc);
                                                        if (uVar4 == 0) {
                                                          return 0;
                                                        }
                                                        pcVar6 = "init glob";
                                                        uVar5 = 0x4dc;
                                                      }
                                                      else {
                                                        pcVar6 = "add quad";
                                                        uVar5 = 0x4da;
                                                      }
                                                    }
                                                    else {
                                                      pcVar6 = "add quad";
                                                      uVar5 = 0x4d4;
                                                    }
                                                  }
                                                  else {
                                                    pcVar6 = "add quad";
                                                    uVar5 = 0x4ce;
                                                  }
                                                }
                                                else {
                                                  pcVar6 = "add quad";
                                                  uVar5 = 0x4c7;
                                                }
                                              }
                                              else {
                                                pcVar6 = "add quad";
                                                uVar5 = 0x4c0;
                                              }
                                            }
                                            else {
                                              pcVar6 = "add quad";
                                              uVar5 = 0x4b9;
                                            }
                                          }
                                          else {
                                            pcVar6 = "add quad";
                                            uVar5 = 0x4b2;
                                          }
                                        }
                                        else {
                                          pcVar6 = "add quad";
                                          uVar5 = 0x4aa;
                                        }
                                      }
                                      else {
                                        pcVar6 = "add node";
                                        uVar5 = 0x49f;
                                      }
                                    }
                                    else {
                                      pcVar6 = "add node";
                                      uVar5 = 0x49a;
                                    }
                                  }
                                  else {
                                    pcVar6 = "add node";
                                    uVar5 = 0x495;
                                  }
                                }
                                else {
                                  pcVar6 = "add node";
                                  uVar5 = 0x490;
                                }
                              }
                              else {
                                pcVar6 = "add quad";
                                uVar5 = 0x48e;
                              }
                            }
                            else {
                              pcVar6 = "add quad";
                              uVar5 = 0x487;
                            }
                          }
                          else {
                            pcVar6 = "add quad";
                            uVar5 = 0x480;
                          }
                        }
                        else {
                          pcVar6 = "add quad";
                          uVar5 = 0x479;
                        }
                      }
                      else {
                        pcVar6 = "add quad";
                        uVar5 = 0x469;
                      }
                    }
                    else {
                      pcVar6 = "add prism";
                      uVar5 = 0x462;
                    }
                  }
                  else {
                    pcVar6 = "add node";
                    uVar5 = 0x45d;
                  }
                }
                else {
                  pcVar6 = "add node";
                  uVar5 = 0x458;
                }
              }
              else {
                pcVar6 = "add node";
                uVar5 = 0x453;
              }
            }
            else {
              pcVar6 = "add node";
              uVar5 = 0x44e;
            }
          }
          else {
            pcVar6 = "add node";
            uVar5 = 0x449;
          }
        }
        else {
          pcVar6 = "add node";
          uVar5 = 0x444;
        }
      }
      else {
        pcVar6 = "add node";
        uVar5 = 0x43f;
      }
    }
    else {
      pcVar6 = "add node";
      uVar5 = 0x43a;
    }
  }
  else {
    pcVar6 = "create";
    uVar5 = 0x436;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",uVar5,
         "ref_fixture_hanging_hex_pri_grid",(ulong)uVar4,pcVar6);
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_fixture_hanging_hex_pri_grid(REF_GRID *ref_grid_ptr,
                                                    REF_MPI ref_mpi) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_INT nodes[8] = {0, 1, 2, 3, 4, 5, 6, 7};
  REF_INT cell, node;

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create");
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid_node(ref_grid);

  RSS(ref_node_add(ref_node, 0, &node), "add node");
  ref_node_xyz(ref_node, 0, node) = 0.0;
  ref_node_xyz(ref_node, 1, node) = 0.0;
  ref_node_xyz(ref_node, 2, node) = 0.0;

  RSS(ref_node_add(ref_node, 1, &node), "add node");
  ref_node_xyz(ref_node, 0, node) = 1.0;
  ref_node_xyz(ref_node, 1, node) = 0.0;
  ref_node_xyz(ref_node, 2, node) = 0.0;

  RSS(ref_node_add(ref_node, 2, &node), "add node");
  ref_node_xyz(ref_node, 0, node) = 1.0;
  ref_node_xyz(ref_node, 1, node) = 1.0;
  ref_node_xyz(ref_node, 2, node) = 0.0;

  RSS(ref_node_add(ref_node, 3, &node), "add node");
  ref_node_xyz(ref_node, 0, node) = 0.0;
  ref_node_xyz(ref_node, 1, node) = 1.0;
  ref_node_xyz(ref_node, 2, node) = 0.0;

  RSS(ref_node_add(ref_node, 4, &node), "add node");
  ref_node_xyz(ref_node, 0, node) = 0.0;
  ref_node_xyz(ref_node, 1, node) = 0.0;
  ref_node_xyz(ref_node, 2, node) = 1.0;

  RSS(ref_node_add(ref_node, 5, &node), "add node");
  ref_node_xyz(ref_node, 0, node) = 1.0;
  ref_node_xyz(ref_node, 1, node) = 0.0;
  ref_node_xyz(ref_node, 2, node) = 1.0;

  RSS(ref_node_add(ref_node, 6, &node), "add node");
  ref_node_xyz(ref_node, 0, node) = 1.0;
  ref_node_xyz(ref_node, 1, node) = 1.0;
  ref_node_xyz(ref_node, 2, node) = 1.0;

  RSS(ref_node_add(ref_node, 7, &node), "add node");
  ref_node_xyz(ref_node, 0, node) = 0.0;
  ref_node_xyz(ref_node, 1, node) = 1.0;
  ref_node_xyz(ref_node, 2, node) = 1.0;

  RSS(ref_cell_add(ref_grid_hex(ref_grid), nodes, &cell), "add prism");

  nodes[0] = 0;
  nodes[1] = 1;
  nodes[2] = 2;
  nodes[3] = 3;
  nodes[4] = 10;
  RSS(ref_cell_add(ref_grid_qua(ref_grid), nodes, &cell), "add quad");

  /*
  nodes[0] = 4;
  nodes[1] = 7;
  nodes[2] = 6;
  nodes[3] = 5;
  nodes[4] = 10;
  RSS(ref_cell_add(ref_grid_qua(ref_grid), nodes, &cell), "add quad");
  */

  nodes[0] = 1;
  nodes[1] = 5;
  nodes[2] = 6;
  nodes[3] = 2;
  nodes[4] = 10;
  RSS(ref_cell_add(ref_grid_qua(ref_grid), nodes, &cell), "add quad");

  nodes[0] = 0;
  nodes[1] = 3;
  nodes[2] = 7;
  nodes[3] = 4;
  nodes[4] = 10;
  RSS(ref_cell_add(ref_grid_qua(ref_grid), nodes, &cell), "add quad");

  nodes[0] = 0;
  nodes[1] = 4;
  nodes[2] = 5;
  nodes[3] = 1;
  nodes[4] = 10;
  RSS(ref_cell_add(ref_grid_qua(ref_grid), nodes, &cell), "add quad");

  nodes[0] = 2;
  nodes[1] = 6;
  nodes[2] = 7;
  nodes[3] = 3;
  nodes[4] = 10;
  RSS(ref_cell_add(ref_grid_qua(ref_grid), nodes, &cell), "add quad");

  RSS(ref_node_add(ref_node, 8, &node), "add node");
  ref_node_xyz(ref_node, 0, node) = 0.0;
  ref_node_xyz(ref_node, 1, node) = 0.0;
  ref_node_xyz(ref_node, 2, node) = 2.0;

  RSS(ref_node_add(ref_node, 9, &node), "add node");
  ref_node_xyz(ref_node, 0, node) = 1.0;
  ref_node_xyz(ref_node, 1, node) = 0.0;
  ref_node_xyz(ref_node, 2, node) = 2.0;

  RSS(ref_node_add(ref_node, 10, &node), "add node");
  ref_node_xyz(ref_node, 0, node) = 1.0;
  ref_node_xyz(ref_node, 1, node) = 1.0;
  ref_node_xyz(ref_node, 2, node) = 2.0;

  RSS(ref_node_add(ref_node, 11, &node), "add node");
  ref_node_xyz(ref_node, 0, node) = 0.0;
  ref_node_xyz(ref_node, 1, node) = 1.0;
  ref_node_xyz(ref_node, 2, node) = 2.0;

  nodes[0] = 4;
  nodes[1] = 5;
  nodes[2] = 7;
  nodes[3] = 8;
  nodes[4] = 9;
  nodes[5] = 11;
  RSS(ref_cell_add(ref_grid_pri(ref_grid), nodes, &cell), "add quad");

  nodes[0] = 5;
  nodes[1] = 6;
  nodes[2] = 7;
  nodes[3] = 9;
  nodes[4] = 10;
  nodes[5] = 11;
  RSS(ref_cell_add(ref_grid_pri(ref_grid), nodes, &cell), "add quad");

  nodes[0] = 5;
  nodes[1] = 9;
  nodes[2] = 10;
  nodes[3] = 6;
  nodes[4] = 10;
  RSS(ref_cell_add(ref_grid_qua(ref_grid), nodes, &cell), "add quad");

  nodes[0] = 4;
  nodes[1] = 7;
  nodes[2] = 11;
  nodes[3] = 8;
  nodes[4] = 10;
  RSS(ref_cell_add(ref_grid_qua(ref_grid), nodes, &cell), "add quad");

  nodes[0] = 4;
  nodes[1] = 8;
  nodes[2] = 9;
  nodes[3] = 5;
  nodes[4] = 10;
  RSS(ref_cell_add(ref_grid_qua(ref_grid), nodes, &cell), "add quad");

  nodes[0] = 6;
  nodes[1] = 10;
  nodes[2] = 11;
  nodes[3] = 7;
  nodes[4] = 10;
  RSS(ref_cell_add(ref_grid_qua(ref_grid), nodes, &cell), "add quad");

  nodes[0] = 8;
  nodes[1] = 11;
  nodes[2] = 9;
  nodes[3] = 10;
  RSS(ref_cell_add(ref_grid_tri(ref_grid), nodes, &cell), "add quad");

  nodes[0] = 9;
  nodes[1] = 11;
  nodes[2] = 10;
  nodes[3] = 10;
  RSS(ref_cell_add(ref_grid_tri(ref_grid), nodes, &cell), "add quad");

  RSS(ref_node_initialize_n_global(ref_node, 12), "init glob");

  return REF_SUCCESS;
}